

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::DefaultsTest::CompareAndLog
          (DefaultsTest *this,GLint value_ref,GLint value_dst,GLenum pname)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  GLenum local_24;
  GLint local_20;
  GLenum pname_local;
  GLint value_dst_local;
  GLint value_ref_local;
  DefaultsTest *this_local;
  
  if (value_ref != value_dst) {
    local_24 = pname;
    local_20 = value_dst;
    pname_local = value_ref;
    _value_dst_local = this;
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [24])"Queried value of pname ");
    EVar2 = glu::getTextureParameterStr(local_24);
    local_1c8[0].m_getName = EVar2.m_getName;
    local_1c8[0].m_value = EVar2.m_value;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [14])0x29b79a0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_20);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [11])0x2a7e7ab);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)&pname_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [27])0x2a84efa);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  return value_ref == value_dst;
}

Assistant:

bool DefaultsTest::CompareAndLog(glw::GLint value_ref, glw::GLint value_dst, glw::GLenum pname)
{
	if (value_ref != value_dst)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Queried value of pname "
											<< glu::getTextureParameterStr(pname) << " is equal to " << value_dst
											<< ", however " << value_ref << " was expected. Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}